

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_unchoke_limit(session_impl *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  session_settings *this_00;
  element_type *peVar5;
  element_type *this_01;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  shared_ptr<libtorrent::aux::peer_connection> *p;
  iterator __end3;
  iterator __begin3;
  connection_map *__range3;
  performance_warning_t local_2c;
  torrent_handle local_28;
  int local_14;
  session_impl *psStack_10;
  int allowed_upload_slots;
  session_impl *this_local;
  
  psStack_10 = this;
  local_14 = get_int_setting(this,0x4053);
  counters::set_value(&this->m_stats_counters,0xfd,(long)local_14);
  iVar2 = session_settings::get_int(&this->m_settings,0x4047);
  if ((local_14 / 2 <= iVar2) &&
     (bVar1 = alert_manager::should_post<libtorrent::performance_alert>(&this->m_alerts), bVar1)) {
    local_28.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_28.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    torrent_handle::torrent_handle(&local_28);
    local_2c = too_many_optimistic_unchoke_slots;
    alert_manager::
    emplace_alert<libtorrent::performance_alert,libtorrent::torrent_handle,libtorrent::performance_alert::performance_warning_t>
              (&this->m_alerts,&local_28,&local_2c);
    torrent_handle::~torrent_handle(&local_28);
  }
  this_00 = settings(this);
  iVar3 = session_settings::get_int(this_00,0x401f);
  iVar2 = local_14;
  if (iVar3 == 0) {
    iVar3 = ::std::numeric_limits<int>::max();
    if (iVar2 == iVar3) {
      __end3 = ::std::
               set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
               ::begin(&this->m_connections);
      p = (shared_ptr<libtorrent::aux::peer_connection> *)
          ::std::
          set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
          ::end(&this->m_connections);
      while (bVar1 = ::std::operator!=(&__end3,(_Self *)&p), bVar1) {
        t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ::std::_Rb_tree_const_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_>::
               operator*(&__end3);
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)t.
                                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
        uVar4 = (*(peVar5->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
        if ((uVar4 & 1) == 0) {
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)t.
                                   super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
          bVar1 = peer_connection::is_connecting(peVar5);
          if (!bVar1) {
            peVar5 = ::std::
                     __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)t.
                                     super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
            uVar4 = (*(peVar5->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
            if ((uVar4 & 1) != 0) {
              peVar5 = ::std::
                       __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)t.
                                       super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
              uVar4 = (*(peVar5->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
              if ((uVar4 & 1) == 0) {
                peVar5 = ::std::
                         __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)t.
                                         super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                bVar1 = peer_connection::ignore_unchoke_slots(peVar5);
                if (!bVar1) {
                  ::std::
                  __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)t.
                                  super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
                  peer_connection::associated_torrent((peer_connection *)local_80);
                  ::std::weak_ptr<libtorrent::aux::torrent>::lock
                            ((weak_ptr<libtorrent::aux::torrent> *)local_70);
                  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
                            ((weak_ptr<libtorrent::aux::torrent> *)local_80);
                  this_01 = ::std::
                            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)local_70);
                  peVar5 = ::std::
                           __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator*((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)t.
                                          super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi);
                  torrent::unchoke_peer(this_01,peVar5,false);
                  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                            ((shared_ptr<libtorrent::aux::torrent> *)local_70);
                }
              }
            }
          }
        }
        ::std::_Rb_tree_const_iterator<std::shared_ptr<libtorrent::aux::peer_connection>_>::
        operator++(&__end3);
      }
    }
    else {
      this->m_unchoke_time_scaler = 0;
    }
  }
  return;
}

Assistant:

void session_impl::update_unchoke_limit()
	{
		int const allowed_upload_slots = get_int_setting(settings_pack::unchoke_slots_limit);

		m_stats_counters.set_value(counters::num_unchoke_slots
			, allowed_upload_slots);

		if (m_settings.get_int(settings_pack::num_optimistic_unchoke_slots)
			>= allowed_upload_slots / 2)
		{
			if (m_alerts.should_post<performance_alert>())
				m_alerts.emplace_alert<performance_alert>(torrent_handle()
					, performance_alert::too_many_optimistic_unchoke_slots);
		}

		if (settings().get_int(settings_pack::choking_algorithm) != settings_pack::fixed_slots_choker)
			return;

		if (allowed_upload_slots == std::numeric_limits<int>::max())
		{
			// this means we're not applying upload slot limits, unchoke
			// everyone
			for (auto const& p : m_connections)
			{
				if (p->is_disconnecting()
					|| p->is_connecting()
					|| !p->is_choked()
					|| p->in_handshake()
					|| p->ignore_unchoke_slots()
					)
					continue;

				auto const t = p->associated_torrent().lock();
				t->unchoke_peer(*p);
			}
		}
		else
		{
			// trigger recalculating unchoke slots
			m_unchoke_time_scaler = 0;
		}
	}